

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Read<unsigned_short>(KDataStream *this,unsigned_short *T)

{
  reference pvVar1;
  byte local_1b;
  unsigned_short local_1a;
  KUINT8 i;
  unsigned_short *puStack_18;
  NetToDataType<unsigned_short> OctArray;
  unsigned_short *T_local;
  KDataStream *this_local;
  
  puStack_18 = T;
  T_local = (unsigned_short *)this;
  NetToDataType<unsigned_short>::NetToDataType((NetToDataType<unsigned_short> *)&local_1a,*T,false);
  local_1b = 0;
  while (local_1b < 2) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_vBuffer,(ulong)this->m_ui16CurrentWritePos);
    *(value_type *)((long)&local_1a + (ulong)local_1b) = *pvVar1;
    local_1b = local_1b + 1;
    this->m_ui16CurrentWritePos = this->m_ui16CurrentWritePos + 1;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<unsigned_short>::SwapBytes((NetToDataType<unsigned_short> *)&local_1a);
  }
  *puStack_18 = local_1a;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}